

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_x11_req(LIBSSH2_CHANNEL *channel,int single_connection,char *auth_proto,
                   char *auth_cookie,int screen_number)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  char *local_a8;
  size_t local_a0;
  size_t local_98;
  uchar *puStack_88;
  uchar code;
  uchar *data;
  size_t data_len;
  uchar buffer [17];
  int i;
  int rc;
  size_t cookie_len;
  size_t proto_len;
  uchar *s;
  LIBSSH2_SESSION *session;
  char *pcStack_30;
  int screen_number_local;
  char *auth_cookie_local;
  char *auth_proto_local;
  LIBSSH2_CHANNEL *pLStack_18;
  int single_connection_local;
  LIBSSH2_CHANNEL *channel_local;
  
  s = (uchar *)channel->session;
  session._4_4_ = screen_number;
  pcStack_30 = auth_cookie;
  auth_cookie_local = auth_proto;
  auth_proto_local._4_4_ = single_connection;
  pLStack_18 = channel;
  if (auth_proto == (char *)0x0) {
    local_98 = 0x12;
  }
  else {
    local_98 = strlen(auth_proto);
  }
  if (pcStack_30 == (char *)0x0) {
    local_a0 = 0x20;
  }
  else {
    local_a0 = strlen(pcStack_30);
  }
  if (pLStack_18->reqX11_state == libssh2_NB_state_idle) {
    pLStack_18->reqX11_packet_len = local_98 + local_a0 + 0x1e;
    memset(&pLStack_18->reqX11_packet_requirev_state,0,8);
    puVar3 = (uchar *)(**(code **)(s + 8))(pLStack_18->reqX11_packet_len,s);
    pLStack_18->reqX11_packet = puVar3;
    if (pLStack_18->reqX11_packet == (uchar *)0x0) {
      proto_len = (size_t)puVar3;
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-6,"Unable to allocate memory for pty-request");
      return iVar2;
    }
    proto_len = (size_t)(puVar3 + 1);
    *puVar3 = 'b';
    _libssh2_store_u32((uchar **)&proto_len,(pLStack_18->remote).id);
    _libssh2_store_str((uchar **)&proto_len,"x11-req",7);
    lVar4 = proto_len + 1;
    *(undefined1 *)proto_len = 1;
    proto_len = proto_len + 2;
    *(bool *)lVar4 = auth_proto_local._4_4_ != 0;
    if (auth_cookie_local == (char *)0x0) {
      local_a8 = "MIT-MAGIC-COOKIE-1";
    }
    else {
      local_a8 = auth_cookie_local;
    }
    _libssh2_store_str((uchar **)&proto_len,local_a8,local_98);
    _libssh2_store_u32((uchar **)&proto_len,(uint32_t)local_a0);
    if (pcStack_30 == (char *)0x0) {
      iVar2 = _libssh2_openssl_random(&data_len,0x10);
      if (iVar2 != 0) {
        iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-0x31,
                               "Unable to get random bytes for x11-req cookie");
        return iVar2;
      }
      for (stack0xffffffffffffffa0 = 0; stack0xffffffffffffffa0 < 0x10;
          stack0xffffffffffffffa0 = stack0xffffffffffffffa0 + 1) {
        snprintf((char *)(proto_len + (long)(stack0xffffffffffffffa0 << 1)),3,"%02X",
                 (ulong)buffer[(long)stack0xffffffffffffffa0 + -8]);
      }
    }
    else {
      memcpy((void *)proto_len,pcStack_30,local_a0);
    }
    proto_len = local_a0 + proto_len;
    _libssh2_store_u32((uchar **)&proto_len,session._4_4_);
    pLStack_18->reqX11_state = libssh2_NB_state_created;
  }
  if (pLStack_18->reqX11_state == libssh2_NB_state_created) {
    iVar2 = _libssh2_transport_send
                      ((LIBSSH2_SESSION *)s,pLStack_18->reqX11_packet,pLStack_18->reqX11_packet_len,
                       (uchar *)0x0,0);
    if (iVar2 == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)s,-0x25,"Would block sending X11-req packet");
      return -0x25;
    }
    if (iVar2 != 0) {
      (**(code **)(s + 0x18))(pLStack_18->reqX11_packet,s);
      pLStack_18->reqX11_packet = (uchar *)0x0;
      pLStack_18->reqX11_state = libssh2_NB_state_idle;
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,iVar2,"Unable to send x11-req packet");
      return iVar2;
    }
    (**(code **)(s + 0x18))(pLStack_18->reqX11_packet,s);
    pLStack_18->reqX11_packet = (uchar *)0x0;
    _libssh2_htonu32(pLStack_18->reqX11_local_channel,(pLStack_18->local).id);
    pLStack_18->reqX11_state = libssh2_NB_state_sent;
  }
  if (pLStack_18->reqX11_state == libssh2_NB_state_sent) {
    iVar2 = _libssh2_packet_requirev
                      ((LIBSSH2_SESSION *)s,"cd",&stack0xffffffffffffff78,(size_t *)&data,1,
                       pLStack_18->reqX11_local_channel,4,&pLStack_18->reqX11_packet_requirev_state)
    ;
    if (iVar2 == -0x25) {
      return -0x25;
    }
    if ((iVar2 != 0) || (data == (uchar *)0x0)) {
      pLStack_18->reqX11_state = libssh2_NB_state_idle;
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,iVar2,"waiting for x11-req response packet");
      return iVar2;
    }
    uVar1 = *puStack_88;
    (**(code **)(s + 0x18))(puStack_88,s);
    pLStack_18->reqX11_state = libssh2_NB_state_idle;
    if (uVar1 == 'c') {
      return 0;
    }
  }
  iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-0x16,"Unable to complete request for channel x11-req"
                        );
  return iVar2;
}

Assistant:

static int
channel_x11_req(LIBSSH2_CHANNEL *channel, int single_connection,
                const char *auth_proto, const char *auth_cookie,
                int screen_number)
{
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *s;
    static const unsigned char reply_codes[3] =
        { SSH_MSG_CHANNEL_SUCCESS, SSH_MSG_CHANNEL_FAILURE, 0 };
    size_t proto_len =
        auth_proto ? strlen(auth_proto) : (sizeof("MIT-MAGIC-COOKIE-1") - 1);
    size_t cookie_len =
        auth_cookie ? strlen(auth_cookie) : LIBSSH2_X11_RANDOM_COOKIE_LEN;
    int rc;

    if(channel->reqX11_state == libssh2_NB_state_idle) {
        /* 30 = packet_type(1) + channel(4) + x11_req_len(4) + "x11-req"(7) +
         * want_reply(1) + single_cnx(1) + proto_len(4) + cookie_len(4) +
         * screen_num(4) */
        channel->reqX11_packet_len = proto_len + cookie_len + 30;

        /* Zero the whole thing out */
        memset(&channel->reqX11_packet_requirev_state, 0,
               sizeof(channel->reqX11_packet_requirev_state));

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Requesting x11-req for channel %u/%u: single=%d "
                       "proto=%s cookie=%s screen=%d",
                       channel->local.id, channel->remote.id,
                       single_connection,
                       auth_proto ? auth_proto : "MIT-MAGIC-COOKIE-1",
                       auth_cookie ? auth_cookie : "<random>", screen_number));

        s = channel->reqX11_packet =
            LIBSSH2_ALLOC(session, channel->reqX11_packet_len);
        if(!channel->reqX11_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for pty-request");
        }

        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, "x11-req", sizeof("x11-req") - 1);

        *(s++) = 0x01;          /* want_reply */
        *(s++) = single_connection ? 0x01 : 0x00;

        _libssh2_store_str(&s, auth_proto ? auth_proto : "MIT-MAGIC-COOKIE-1",
                           proto_len);

        _libssh2_store_u32(&s, (uint32_t)cookie_len);
        if(auth_cookie) {
            memcpy(s, auth_cookie, cookie_len);
        }
        else {
            int i;
            /* note: the extra +1 below is necessary since the sprintf()
               loop will always write 3 bytes so the last one will write
               the trailing zero at the LIBSSH2_X11_RANDOM_COOKIE_LEN/2
               border */
            unsigned char buffer[(LIBSSH2_X11_RANDOM_COOKIE_LEN / 2) + 1];

            if(_libssh2_random(buffer, LIBSSH2_X11_RANDOM_COOKIE_LEN / 2)) {
                return _libssh2_error(session, LIBSSH2_ERROR_RANDGEN,
                                      "Unable to get random bytes "
                                      "for x11-req cookie");
            }
            for(i = 0; i < (LIBSSH2_X11_RANDOM_COOKIE_LEN / 2); i++) {
                snprintf((char *)&s[i*2], 3, "%02X", buffer[i]);
            }
        }
        s += cookie_len;

        _libssh2_store_u32(&s, screen_number);
        channel->reqX11_state = libssh2_NB_state_created;
    }

    if(channel->reqX11_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, channel->reqX11_packet,
                                     channel->reqX11_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc,
                           "Would block sending X11-req packet");
            return rc;
        }
        if(rc) {
            LIBSSH2_FREE(session, channel->reqX11_packet);
            channel->reqX11_packet = NULL;
            channel->reqX11_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "Unable to send x11-req packet");
        }
        LIBSSH2_FREE(session, channel->reqX11_packet);
        channel->reqX11_packet = NULL;

        _libssh2_htonu32(channel->reqX11_local_channel, channel->local.id);

        channel->reqX11_state = libssh2_NB_state_sent;
    }

    if(channel->reqX11_state == libssh2_NB_state_sent) {
        size_t data_len;
        unsigned char *data;
        unsigned char code;

        rc = _libssh2_packet_requirev(session, reply_codes, &data, &data_len,
                                      1, channel->reqX11_local_channel, 4,
                                      &channel->reqX11_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc || data_len < 1) {
            channel->reqX11_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "waiting for x11-req response packet");
        }

        code = data[0];
        LIBSSH2_FREE(session, data);
        channel->reqX11_state = libssh2_NB_state_idle;

        if(code == SSH_MSG_CHANNEL_SUCCESS)
            return 0;
    }

    return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Unable to complete request for channel x11-req");
}